

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void container_suite::test_set_empty(void)

{
  size_t *this;
  undefined4 local_10c;
  size_type local_108 [3];
  char *msg;
  undefined1 local_e0 [8];
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> value;
  iarchive in;
  value_type input [5];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ = 0x91;
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0x93829290;
  this = &value.data._M_t._M_impl.super__Rb_tree_header._M_node_count;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[5]>
            ((iarchive *)this,
             (uchar (*) [5])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_>::type_struct
            ((type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_e0);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)this,
             (type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_e0);
  local_108[0] = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_e0);
  local_10c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.data.size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x324,"void container_suite::test_set_empty()",local_108,&local_10c);
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~type_struct
            ((type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_e0);
  trial::protocol::bintoken::iarchive::~iarchive
            ((iarchive *)&value.data._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void test_set_empty()
{
    const value_type input[] = { token::code::begin_record,
                                 token::code::begin_array,
                                 token::code::null,
                                 token::code::end_array,
                                 token::code::end_record };
    format::iarchive in(input);
    type_struct< std::set<int> > value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.data.size(), 0);
}